

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O1

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onRecoverableException
          (MockExceptionCallback *this,Exception *exception)

{
  string *this_00;
  char *pcVar1;
  String what;
  char *pcVar2;
  size_t sVar3;
  StringPtr local_58;
  StringPtr local_48;
  undefined8 *local_38;
  char *local_30;
  undefined8 local_28;
  
  this_00 = &this->text;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this_00,"recoverable exception: ");
  kj::operator*(&local_48,exception);
  local_30 = "\nstack: ";
  local_28 = 9;
  pcVar1 = local_48.content.ptr;
  if (local_48.content.size_ == 0) {
    pcVar1 = "";
  }
  pcVar2 = local_48.content.ptr;
  sVar3 = local_48.content.size_;
  local_48.content.ptr = pcVar1;
  local_48.content.size_ = local_48.content.size_ + (local_48.content.size_ == 0);
  StringPtr::find(&local_58,&local_48);
  if ((char)local_58.content.ptr == '\x01') {
    pcVar1 = pcVar2;
    if (sVar3 == 0) {
      pcVar1 = "";
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (this_00,(this->text)._M_string_length,0,pcVar1,local_58.content.size_);
  }
  else {
    pcVar1 = "";
    if (sVar3 != 0) {
      pcVar1 = pcVar2;
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,pcVar1);
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (this_00,'\n');
  flush(this);
  if (pcVar2 != (char *)0x0) {
    (**(code **)*local_38)(local_38,pcVar2,1,sVar3,sVar3,0,0,0);
  }
  return;
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    text += "recoverable exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    KJ_IF_SOME(end, what.find("\nstack: ")) {
      text.append(what.cStr(), what.cStr()+end);
    } else {
      text += what.cStr();
    }